

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[7],_int> * __thiscall
fmt::v8::
make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,char_const(&)[7],int&>
          (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[7],_int>
           *__return_storage_ptr__,v8 *this,char (*args) [7],int *args_1)

{
  int *args_local_1;
  char (*args_local) [7];
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  char_type **arg;
  size_t local_a0;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_const_1;
  bool formattable_char_1;
  int *arg_1;
  longlong local_58;
  size_t local_50;
  
  local_58._0_4_ = *(undefined4 *)*args;
  (__return_storage_ptr__->data_).args_[0].field_0.named_args.data = (named_arg_info<char> *)this;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_a0;
  (__return_storage_ptr__->data_).args_[1].field_0.long_long_value = local_58;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_50;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {std::forward<Args>(args)...};
}